

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_delete_property(JSContext *ctx,JSValue obj,JSAtom atom)

{
  JSValue obj_00;
  JSValue v;
  JSValue v_00;
  JSValue val;
  JSValue this_obj;
  JSValue obj_01;
  JSValue func_obj;
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSContext *in_RDI;
  JSValue JVar4;
  JSPropertyDescriptor desc;
  JSAtom in_stack_00000054;
  JSObject *in_stack_00000058;
  JSPropertyDescriptor *in_stack_00000060;
  JSContext *in_stack_00000068;
  JSValue args [2];
  int is_extensible;
  int res2;
  int res;
  JSValue atom_val;
  JSValue ret;
  JSValue method;
  JSProxyData *s;
  undefined8 in_stack_fffffffffffffef8;
  JSAtom atom_00;
  JSContext *ctx_00;
  JSValueUnion in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  JSAtom in_stack_ffffffffffffff34;
  JSValueUnion in_stack_ffffffffffffff38;
  JSValueUnion in_stack_ffffffffffffff40;
  JSValueUnion in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [16];
  JSContext *in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff70;
  list_head *in_stack_ffffffffffffff78;
  JSValue local_40;
  
  atom_00 = (JSAtom)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  JVar4.tag = (int64_t)in_stack_ffffffffffffff78;
  JVar4.u.float64 = in_stack_ffffffffffffff70.float64;
  JVar3.ptr = get_proxy_method(in_stack_ffffffffffffff68,in_stack_ffffffffffffff58._8_8_,JVar4,
                               in_stack_ffffffffffffff58._4_4_);
  if ((JSProxyData *)JVar3.ptr == (JSProxyData *)0x0) {
    return -1;
  }
  iVar1 = JS_IsUndefined(local_40);
  if (iVar1 != 0) {
    obj_01.tag = (int64_t)in_stack_ffffffffffffff48.ptr;
    obj_01.u.ptr = in_stack_ffffffffffffff40.ptr;
    iVar1 = JS_DeleteProperty((JSContext *)in_stack_ffffffffffffff38.ptr,obj_01,
                              in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    return iVar1;
  }
  JVar4 = JS_AtomToValue((JSContext *)in_stack_ffffffffffffff00.ptr,atom_00);
  iVar1 = JS_IsException(JVar4);
  if (iVar1 != 0) {
    v.tag._0_4_ = in_stack_ffffffffffffff10;
    v.u.ptr = (void *)in_stack_ffffffffffffff08;
    v.tag._4_4_ = in_stack_ffffffffffffff14;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff00.ptr,v);
    return -1;
  }
  ctx_00 = (JSContext *)&stack0xffffffffffffff68;
  func_obj.tag = in_stack_ffffffffffffff50;
  func_obj.u.ptr = in_stack_ffffffffffffff48.ptr;
  this_obj.tag = (int64_t)in_stack_ffffffffffffff40.ptr;
  this_obj.u.ptr = in_stack_ffffffffffffff38.ptr;
  JVar4 = JS_CallFree((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      func_obj,this_obj,in_stack_ffffffffffffff2c,*(JSValue **)((long)JVar3.ptr + 8)
                     );
  v_00.tag._0_4_ = in_stack_ffffffffffffff10;
  v_00.u.ptr = (void *)in_stack_ffffffffffffff08;
  v_00.tag._4_4_ = in_stack_ffffffffffffff14;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff00.ptr,v_00);
  iVar1 = JS_IsException(JVar4);
  if (iVar1 != 0) {
    return -1;
  }
  val.u._4_4_ = in_stack_ffffffffffffff34;
  val.u.int32 = in_stack_ffffffffffffff30;
  val.tag = (int64_t)in_stack_ffffffffffffff38.ptr;
  iVar1 = JS_ToBoolFree((JSContext *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        val);
  if (iVar1 == 0) {
    return 0;
  }
  iVar2 = JS_GetOwnPropertyInternal
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    return iVar1;
  }
  if ((in_stack_ffffffffffffff10 & 1) != 0) {
    obj_00.tag = in_stack_ffffffffffffff08;
    obj_00.u.ptr = in_stack_ffffffffffffff00.ptr;
    iVar2 = JS_IsExtensible(ctx_00,obj_00);
    if (iVar2 < 0) goto LAB_0017b3ad;
    if (iVar2 != 0) {
      js_free_desc((JSContext *)in_stack_ffffffffffffff00.ptr,(JSPropertyDescriptor *)ctx_00);
      return iVar1;
    }
  }
  JVar4 = JS_ThrowTypeError(in_RDI,"proxy: inconsistent deleteProperty");
  in_stack_ffffffffffffff00 = JVar4.u;
LAB_0017b3ad:
  js_free_desc((JSContext *)in_stack_ffffffffffffff00.ptr,(JSPropertyDescriptor *)ctx_00);
  return -1;
}

Assistant:

static int js_proxy_delete_property(JSContext *ctx, JSValueConst obj,
                                    JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret, atom_val;
    int res, res2, is_extensible;
    JSValueConst args[2];

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_deleteProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DeleteProperty(ctx, s->target, atom, 0);
    }
    atom_val = JS_AtomToValue(ctx, atom);;
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    if (res) {
        JSPropertyDescriptor desc;
        res2 = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(s->target), atom);
        if (res2 < 0)
            return -1;
        if (res2) {
            if (!(desc.flags & JS_PROP_CONFIGURABLE))
                goto fail;
            is_extensible = JS_IsExtensible(ctx, s->target);
            if (is_extensible < 0)
                goto fail1;
            if (!is_extensible) {
                /* proxy-missing-checks */
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent deleteProperty");
            fail1:
                js_free_desc(ctx, &desc);
                return -1;
            }
            js_free_desc(ctx, &desc);
        }
    }
    return res;
}